

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalNinjaGenerator::AddCustomCommandRule(cmGlobalNinjaGenerator *this)

{
  allocator<char> local_151;
  allocator<char> local_150;
  allocator<char> local_14f;
  allocator<char> local_14e;
  allocator<char> local_14d;
  allocator<char> local_14c;
  allocator<char> local_14b;
  allocator<char> local_14a;
  allocator<char> local_149;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"CUSTOM_COMMAND",&local_149);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"$COMMAND",&local_14a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"$DESC",&local_14b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"Rule for running custom commands.",&local_14c);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"",&local_14d);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_14e);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"",&local_14f);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"",&local_150);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"",&local_151);
  AddRule(this,&local_c8,&local_e8,&local_108,&local_128,&local_148,&local_48,&local_68,&local_88,
          &local_a8,false);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::AddCustomCommandRule()
{
  this->AddRule("CUSTOM_COMMAND", "$COMMAND", "$DESC",
                "Rule for running custom commands.",
                /*depfile*/ "",
                /*deptype*/ "",
                /*rspfile*/ "",
                /*rspcontent*/ "",
                /*restat*/ "", // bound on each build statement as needed
                /*generator*/ false);
}